

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall icu_63::Calendar::validateFields(Calendar *this,UErrorCode *status)

{
  UBool UVar1;
  uint local_1c;
  int32_t field;
  UErrorCode *status_local;
  Calendar *this_local;
  
  for (local_1c = 0; UVar1 = ::U_SUCCESS(*status), UVar1 != '\0' && (int)local_1c < 0x17;
      local_1c = local_1c + 1) {
    if (1 < this->fStamp[(int)local_1c]) {
      (*(this->super_UObject)._vptr_UObject[0x27])(this,(ulong)local_1c,status);
    }
  }
  return;
}

Assistant:

void Calendar::validateFields(UErrorCode &status) {
    for (int32_t field = 0; U_SUCCESS(status) && (field < UCAL_FIELD_COUNT); field++) {
        if (fStamp[field] >= kMinimumUserStamp) {
            validateField((UCalendarDateFields)field, status);
        }
    }
}